

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest_test_different_size_buffers_buffer_Test::
~ZLIBBufferCompressorTest_test_different_size_buffers_buffer_Test
          (ZLIBBufferCompressorTest_test_different_size_buffers_buffer_Test *this)

{
  ZLIBBufferCompressorTest_test_different_size_buffers_buffer_Test *this_local;
  
  ~ZLIBBufferCompressorTest_test_different_size_buffers_buffer_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, test_different_size_buffers_buffer)
{
    for (size_t i = 0; i < 256; i++)
    {
        std::vector<unsigned char> buffer;
        for (unsigned char j = 0; j < i; j++)
        {
            buffer.emplace_back(j);
        }
        TestCompression(buffer, 65536);
        TestCompression(buffer, 8);
        TestCompression(buffer, 65536);
        TestCompression(buffer, 65536);
        TestCompression(buffer, 65536);
    }
}